

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

optional<interfaces::BlockRef> * __thiscall
node::anon_unknown_2::MinerImpl::getTip
          (optional<interfaces::BlockRef> *__return_storage_ptr__,MinerImpl *this)

{
  pointer ppCVar1;
  uint256 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar7;
  Chainstate *pCVar8;
  CBlockIndex *pCVar9;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &cs_main.super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  puVar7 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                      ,0x3df,"chainman","m_node.chainman");
  pCVar8 = ChainstateManager::ActiveChainstate
                     ((puVar7->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar8->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (pCVar8->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar9 = (CBlockIndex *)0x0;
  }
  else {
    pCVar9 = ppCVar1[-1];
  }
  if (pCVar9 == (CBlockIndex *)0x0) {
    bVar6 = false;
  }
  else {
    puVar2 = pCVar9->phashBlock;
    if (puVar2 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    uVar3 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    uVar4 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    uVar5 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>).
             _M_payload.super__Optional_payload_base<interfaces::BlockRef>._M_payload + 0x10) =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>).
             _M_payload.super__Optional_payload_base<interfaces::BlockRef>._M_payload + 0x18) =
         uVar5;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>)._M_payload.
      super__Optional_payload_base<interfaces::BlockRef>._M_payload = uVar3;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>).
             _M_payload.super__Optional_payload_base<interfaces::BlockRef>._M_payload + 8) = uVar4;
    (__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>)._M_payload.
    super__Optional_payload_base<interfaces::BlockRef>._M_payload._M_value.height = pCVar9->nHeight;
    bVar6 = true;
  }
  (__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>)._M_payload.
  super__Optional_payload_base<interfaces::BlockRef>._M_engaged = bVar6;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<BlockRef> getTip() override
    {
        LOCK(::cs_main);
        CBlockIndex* tip{chainman().ActiveChain().Tip()};
        if (!tip) return {};
        return BlockRef{tip->GetBlockHash(), tip->nHeight};
    }